

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O0

Node * __thiscall
anon_unknown.dwarf_375::NinjaMain::CollectTarget(NinjaMain *this,char *cpath,string *err)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  vector<Edge_*,_std::allocator<Edge_*>_> *pvVar4;
  const_reference ppEVar5;
  reference ppNVar6;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  Node *local_138;
  Node *suggestion;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  Edge *local_d0;
  Edge *edge;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  StringPiece local_88;
  NinjaMain *local_78;
  Node *node;
  bool first_dependent;
  uint64_t uStack_68;
  uint64_t slash_bits;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string path;
  string *err_local;
  char *cpath_local;
  NinjaMain *this_local;
  
  path.field_2._8_8_ = err;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,cpath,&local_49);
  std::allocator<char>::~allocator(&local_49);
  bVar1 = CanonicalizePath((string *)local_48,&stack0xffffffffffffff98,(string *)path.field_2._8_8_)
  ;
  if (bVar1) {
    node._3_1_ = 0;
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::size();
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
      if (*pcVar3 == '^') {
        std::__cxx11::string::size();
        std::__cxx11::string::resize((ulong)local_48);
        node._3_1_ = 1;
      }
    }
    StringPiece::StringPiece(&local_88,(string *)local_48);
    local_78 = (NinjaMain *)State::LookupNode(&this->state_,local_88);
    if (local_78 == (NinjaMain *)0x0) {
      Node::PathDecanonicalized((string *)&suggestion,(string *)local_48,uStack_68);
      std::operator+(&local_110,"unknown target \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &suggestion);
      std::operator+(&local_f0,&local_110,"\'");
      std::__cxx11::string::operator=((string *)path.field_2._8_8_,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&suggestion);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,"clean");
      if (bVar1) {
        std::__cxx11::string::operator+=
                  ((string *)path.field_2._8_8_,", did you mean \'ninja -t clean\'?");
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_48,"help");
        if (bVar1) {
          std::__cxx11::string::operator+=
                    ((string *)path.field_2._8_8_,", did you mean \'ninja -h\'?");
        }
        else {
          local_138 = State::SpellcheckNode(&this->state_,(string *)local_48);
          if (local_138 != (Node *)0x0) {
            __rhs = Node::path_abi_cxx11_(local_138);
            std::operator+(&local_178,", did you mean \'",__rhs);
            std::operator+(&local_158,&local_178,"\'?");
            std::__cxx11::string::operator+=((string *)path.field_2._8_8_,(string *)&local_158);
            std::__cxx11::string::~string((string *)&local_158);
            std::__cxx11::string::~string((string *)&local_178);
          }
        }
      }
      this_local = (NinjaMain *)0x0;
    }
    else {
      if ((node._3_1_ & 1) != 0) {
        pvVar4 = Node::out_edges((Node *)local_78);
        bVar1 = std::vector<Edge_*,_std::allocator<Edge_*>_>::empty(pvVar4);
        if (bVar1) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&edge,
                         "\'",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48);
          std::operator+(&local_a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&edge,
                         "\' has no out edge");
          std::__cxx11::string::operator=((string *)path.field_2._8_8_,(string *)&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          std::__cxx11::string::~string((string *)&edge);
          this_local = (NinjaMain *)0x0;
          goto LAB_0010a7fb;
        }
        pvVar4 = Node::out_edges((Node *)local_78);
        ppEVar5 = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[](pvVar4,0);
        local_d0 = *ppEVar5;
        bVar1 = std::vector<Node_*,_std::allocator<Node_*>_>::empty(&local_d0->outputs_);
        if (bVar1) {
          Edge::Dump(local_d0,"");
          Fatal("edge has no outputs");
        }
        ppNVar6 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&local_d0->outputs_,0);
        local_78 = (NinjaMain *)*ppNVar6;
      }
      this_local = local_78;
    }
  }
  else {
    this_local = (NinjaMain *)0x0;
  }
LAB_0010a7fb:
  node._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_48);
  return (Node *)this_local;
}

Assistant:

Node* NinjaMain::CollectTarget(const char* cpath, string* err) {
  string path = cpath;
  uint64_t slash_bits;
  if (!CanonicalizePath(&path, &slash_bits, err))
    return NULL;

  // Special syntax: "foo.cc^" means "the first output of foo.cc".
  bool first_dependent = false;
  if (!path.empty() && path[path.size() - 1] == '^') {
    path.resize(path.size() - 1);
    first_dependent = true;
  }

  Node* node = state_.LookupNode(path);
  if (node) {
    if (first_dependent) {
      if (node->out_edges().empty()) {
        *err = "'" + path + "' has no out edge";
        return NULL;
      }
      Edge* edge = node->out_edges()[0];
      if (edge->outputs_.empty()) {
        edge->Dump();
        Fatal("edge has no outputs");
      }
      node = edge->outputs_[0];
    }
    return node;
  } else {
    *err =
        "unknown target '" + Node::PathDecanonicalized(path, slash_bits) + "'";
    if (path == "clean") {
      *err += ", did you mean 'ninja -t clean'?";
    } else if (path == "help") {
      *err += ", did you mean 'ninja -h'?";
    } else {
      Node* suggestion = state_.SpellcheckNode(path);
      if (suggestion) {
        *err += ", did you mean '" + suggestion->path() + "'?";
      }
    }
    return NULL;
  }
}